

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cc
# Opt level: O2

unordered_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
phosg::list_processes_abi_cxx11_
          (unordered_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,phosg *this,bool with_commands)

{
  int iVar1;
  char *__s;
  unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)> f;
  string name;
  pid_t pid;
  allocator<char> local_82;
  allocator<char> local_81;
  unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)> local_80;
  string local_70;
  string local_50;
  
  __s = "ps -ax -c -o pid -o command | grep [0-9]";
  if ((int)this != 0) {
    __s = "ps -ax -o pid -o command | grep [0-9]";
  }
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,__s,&local_81);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"r",&local_82);
  popen_unique((phosg *)&local_80,&local_70,&local_50);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_70);
  (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
  (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
  (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_M_h)._M_element_count = 0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  do {
    iVar1 = feof((FILE *)local_80._M_t.super___uniq_ptr_impl<_IO_FILE,_void_(*)(_IO_FILE_*)>._M_t.
                         super__Tuple_impl<0UL,__IO_FILE_*,_void_(*)(_IO_FILE_*)>.
                         super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl);
    if (iVar1 != 0) {
      ::std::unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)>::~unique_ptr(&local_80);
      return __return_storage_ptr__;
    }
    __isoc99_fscanf(local_80._M_t.super___uniq_ptr_impl<_IO_FILE,_void_(*)(_IO_FILE_*)>._M_t.
                    super__Tuple_impl<0UL,__IO_FILE_*,_void_(*)(_IO_FILE_*)>.
                    super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl,"%d",&local_50);
    do {
      iVar1 = fgetc((FILE *)local_80._M_t.super___uniq_ptr_impl<_IO_FILE,_void_(*)(_IO_FILE_*)>._M_t
                            .super__Tuple_impl<0UL,__IO_FILE_*,_void_(*)(_IO_FILE_*)>.
                            super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl);
    } while (iVar1 == 0x20);
    ungetc(iVar1,(FILE *)local_80._M_t.super___uniq_ptr_impl<_IO_FILE,_void_(*)(_IO_FILE_*)>._M_t.
                         super__Tuple_impl<0UL,__IO_FILE_*,_void_(*)(_IO_FILE_*)>.
                         super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl);
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    while (iVar1 != 10) {
      iVar1 = fgetc((FILE *)local_80._M_t.super___uniq_ptr_impl<_IO_FILE,_void_(*)(_IO_FILE_*)>._M_t
                            .super__Tuple_impl<0UL,__IO_FILE_*,_void_(*)(_IO_FILE_*)>.
                            super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl);
      if (iVar1 == -1) break;
      if (iVar1 - 0x20U < 0x5f) {
        ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (&local_70,(char)iVar1);
      }
    }
    if (local_70._M_string_length != 0) {
      ::std::
      _Hashtable<int,std::pair<int_const,std::__cxx11::string>,std::allocator<std::pair<int_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<int&,std::__cxx11::string&>
                ((_Hashtable<int,std::pair<int_const,std::__cxx11::string>,std::allocator<std::pair<int_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)__return_storage_ptr__,&local_50,&local_70);
    }
    ::std::__cxx11::string::~string((string *)&local_70);
  } while( true );
}

Assistant:

unordered_map<pid_t, string> list_processes(bool with_commands) {

  auto f = popen_unique(with_commands ? "ps -ax -o pid -o command | grep [0-9]" : "ps -ax -c -o pid -o command | grep [0-9]", "r");

  unordered_map<pid_t, string> ret;
  while (!feof(f.get())) {
    pid_t pid;
    fscanf(f.get(), "%d", &pid);

    int ch;
    while ((ch = fgetc(f.get())) == ' ')
      ;
    ungetc(ch, f.get());

    string name;
    while (ch != '\n') {
      ch = fgetc(f.get());
      if (ch == EOF) {
        break;
      }
      if (ch >= 0x20 && ch < 0x7F) {
        name += (char)ch;
      }
    }

    if (!name.empty()) {
      ret.emplace(pid, name);
    }
  }

  return ret;
}